

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

BOOL __thiscall
Js::RecyclableProxyObjectWalker::Get
          (RecyclableProxyObjectWalker *this,int i,ResolvedObject *pResolvedObject)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  JavascriptProxy *this_00;
  RecyclableObject *pRVar4;
  undefined4 *puVar5;
  IDiagObjectModelDisplay *pIVar6;
  ArenaAllocator *alloc;
  RecyclableObjectAddress *this_01;
  Type TVar7;
  
  this_00 = VarTo<Js::JavascriptProxy>((this->super_RecyclableObjectWalker).instance);
  pRVar4 = JavascriptProxy::GetTarget(this_00);
  BVar3 = 0;
  if (pRVar4 != (RecyclableObject *)0x0) {
    pRVar4 = JavascriptProxy::GetHandler(this_00);
    if (pRVar4 == (RecyclableObject *)0x0) {
      return 0;
    }
    if (i == 1) {
      pResolvedObject->name = L"[handler]";
      pRVar4 = JavascriptProxy::GetHandler(this_00);
    }
    else {
      if (i != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                    ,0xebc,"(false)","false");
        if (bVar2) {
          *puVar5 = 0;
          return 0;
        }
        goto LAB_008c8b5a;
      }
      pResolvedObject->name = L"[target]";
      pRVar4 = JavascriptProxy::GetTarget(this_00);
    }
    pResolvedObject->obj = pRVar4;
    pResolvedObject->propId = -1;
    pResolvedObject->scriptContext = (this->super_RecyclableObjectWalker).scriptContext;
    if (pRVar4 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_008c8b5a;
      *puVar5 = 0;
    }
    if (((ulong)pRVar4 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pRVar4 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) goto LAB_008c8b5a;
      *puVar5 = 0;
    }
    TVar7 = TypeIds_FirstNumberType;
    if ((((ulong)pRVar4 & 0xffff000000000000) != 0x1000000000000) &&
       (TVar7 = TypeIds_Number, (ulong)pRVar4 >> 0x32 == 0)) {
      pRVar4 = UnsafeVarTo<Js::RecyclableObject>(pRVar4);
      if (pRVar4 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) goto LAB_008c8b5a;
        *puVar5 = 0;
      }
      TVar7 = ((pRVar4->type).ptr)->typeId;
      if ((0x57 < (int)TVar7) && (BVar3 = RecyclableObject::IsExternal(pRVar4), BVar3 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
LAB_008c8b5a:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
    }
    pResolvedObject->typeId = TVar7;
    pIVar6 = ResolvedObject::CreateDisplay(pResolvedObject);
    pResolvedObject->objectDisplay = pIVar6;
    (*pIVar6->_vptr_IDiagObjectModelDisplay[6])(pIVar6,0x820);
    alloc = GetArenaFromContext(pResolvedObject->scriptContext);
    this_01 = (RecyclableObjectAddress *)new<Memory::ArenaAllocator>(0x28,alloc,0x366bee);
    RecyclableObjectAddress::RecyclableObjectAddress
              (this_01,(pResolvedObject->scriptContext->super_ScriptContextBase).globalObject,0x126,
               pResolvedObject->obj,0);
    pResolvedObject->address = (IDiagObjectAddress *)this_01;
    BVar3 = 1;
  }
  return BVar3;
}

Assistant:

BOOL RecyclableProxyObjectWalker::Get(int i, ResolvedObject* pResolvedObject)
    {
        JavascriptProxy* proxy = VarTo<JavascriptProxy>(instance);
        if (proxy->GetTarget() == nullptr || proxy->GetHandler() == nullptr)
        {
            return FALSE;
        }
        if (i == 0)
        {
            pResolvedObject->name = _u("[target]");
            pResolvedObject->obj = proxy->GetTarget();
        }
        else if (i == 1)
        {
            pResolvedObject->name = _u("[handler]");
            pResolvedObject->obj = proxy->GetHandler();
        }
        else
        {
            Assert(false);
            return FALSE;
        }

        pResolvedObject->propId = Constants::NoProperty;
        pResolvedObject->scriptContext = scriptContext;
        pResolvedObject->typeId = JavascriptOperators::GetTypeId(pResolvedObject->obj);
        pResolvedObject->objectDisplay = pResolvedObject->CreateDisplay();
        pResolvedObject->objectDisplay->SetDefaultTypeAttribute(DBGPROP_ATTRIB_VALUE_READONLY | DBGPROP_ATTRIB_VALUE_IS_FAKE);
        pResolvedObject->address = Anew(GetArenaFromContext(pResolvedObject->scriptContext),
            RecyclableObjectAddress,
            pResolvedObject->scriptContext->GetGlobalObject(),
            Js::PropertyIds::Proxy,
            pResolvedObject->obj,
            false /*isInDeadZone*/);

        return TRUE;
    }